

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-bench.cpp
# Opt level: O2

double __thiscall test::avg_ts(test *this)

{
  double dVar1;
  _Vector_base<double,_std::allocator<double>_> local_20;
  
  get_ts((vector<double,_std::allocator<double>_> *)&local_20,this);
  dVar1 = avg<double>((vector<double,_std::allocator<double>_> *)&local_20);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_20);
  return dVar1;
}

Assistant:

double avg_ts() const { return ::avg(get_ts()); }